

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber.cc
# Opt level: O0

int CBS_asn1_ber_to_der(CBS *in,CBS *out,uint8_t **out_storage)

{
  int iVar1;
  size_t initial_capacity;
  size_t local_68;
  size_t len;
  undefined1 local_58 [4];
  int conversion_needed;
  CBB cbb;
  uint8_t **out_storage_local;
  CBS *out_local;
  CBS *in_local;
  
  cbb.u._24_8_ = out_storage;
  iVar1 = cbs_find_ber(in,(int *)((long)&len + 4),0);
  if (iVar1 == 0) {
    in_local._4_4_ = 0;
  }
  else if (len._4_4_ == 0) {
    iVar1 = CBS_get_any_asn1_element(in,out,(CBS_ASN1_TAG *)0x0,(size_t *)0x0);
    if (iVar1 == 0) {
      in_local._4_4_ = 0;
    }
    else {
      *(undefined8 *)cbb.u._24_8_ = 0;
      in_local._4_4_ = 1;
    }
  }
  else {
    initial_capacity = CBS_len(in);
    iVar1 = CBB_init((CBB *)local_58,initial_capacity);
    if (((iVar1 != 0) && (iVar1 = cbs_convert_ber(in,(CBB *)local_58,0,0,0), iVar1 != 0)) &&
       (iVar1 = CBB_finish((CBB *)local_58,(uint8_t **)cbb.u._24_8_,&local_68), iVar1 != 0)) {
      CBS_init(out,*(uint8_t **)cbb.u._24_8_,local_68);
      return 1;
    }
    CBB_cleanup((CBB *)local_58);
    in_local._4_4_ = 0;
  }
  return in_local._4_4_;
}

Assistant:

int CBS_asn1_ber_to_der(CBS *in, CBS *out, uint8_t **out_storage) {
  CBB cbb;

  // First, do a quick walk to find any indefinite-length elements. Most of the
  // time we hope that there aren't any and thus we can quickly return.
  int conversion_needed;
  if (!cbs_find_ber(in, &conversion_needed, 0)) {
    return 0;
  }

  if (!conversion_needed) {
    if (!CBS_get_any_asn1_element(in, out, NULL, NULL)) {
      return 0;
    }
    *out_storage = NULL;
    return 1;
  }

  size_t len;
  if (!CBB_init(&cbb, CBS_len(in)) ||
      !cbs_convert_ber(in, &cbb, 0, 0, 0) ||
      !CBB_finish(&cbb, out_storage, &len)) {
    CBB_cleanup(&cbb);
    return 0;
  }

  CBS_init(out, *out_storage, len);
  return 1;
}